

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arcflow.cpp
# Opt level: O0

int __thiscall
Arcflow::min_slack(Arcflow *this,vector<int,_std::allocator<int>_> *b,int i0,int d,
                  vector<int,_std::allocator<int>_> *caps)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  const_reference pvVar4;
  const_reference this_00;
  size_type sVar5;
  reference pvVar6;
  int *piVar7;
  reference piVar8;
  reference rVar9;
  int local_134;
  reference local_130;
  int local_120;
  int local_11c;
  int p;
  int cap;
  const_iterator __end2;
  const_iterator __begin2;
  vector<int,_std::allocator<int>_> *__range2;
  undefined1 auStack_f8 [4];
  int mslack;
  _Bit_type local_f0;
  int local_e4;
  undefined1 auStack_e0 [4];
  int j_1;
  _Bit_type local_d8;
  undefined4 local_d0;
  int local_cc;
  int local_c8;
  int k;
  int v;
  int u;
  int j;
  int qs;
  int *w;
  int local_a8;
  int i;
  int res;
  _Bit_type local_98;
  allocator<bool> local_79;
  undefined1 local_78 [8];
  vector<bool,_std::allocator<bool>_> vis;
  vector<int,_std::allocator<int>_> Q;
  int C;
  vector<int,_std::allocator<int>_> *caps_local;
  int d_local;
  int i0_local;
  vector<int,_std::allocator<int>_> *b_local;
  Arcflow *this_local;
  
  pvVar4 = std::vector<int,_std::allocator<int>_>::back(caps);
  iVar1 = *pvVar4;
  if (iVar1 == 0) {
    this_local._4_4_ = 0;
  }
  else {
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)
               &vis.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                _M_end_of_storage);
    std::allocator<bool>::allocator(&local_79);
    std::vector<bool,_std::allocator<bool>_>::vector
              ((vector<bool,_std::allocator<bool>_> *)local_78,(long)(iVar1 + 1),&local_79);
    std::allocator<bool>::~allocator(&local_79);
    _res = std::vector<bool,_std::allocator<bool>_>::operator[]
                     ((vector<bool,_std::allocator<bool>_> *)local_78,0);
    std::_Bit_reference::operator=((_Bit_reference *)&res,true);
    i = 0;
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)
               &vis.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                _M_end_of_storage,&i);
    local_a8 = 0;
    for (w._4_4_ = i0; iVar2 = local_a8, w._4_4_ < (this->inst).nsizes; w._4_4_ = w._4_4_ + 1) {
      this_00 = std::
                vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                ::operator[](&this->weights,(long)w._4_4_);
      _j = std::vector<int,_std::allocator<int>_>::operator[](this_00,(long)d);
      if (*_j != 0) {
        sVar5 = std::vector<int,_std::allocator<int>_>::size
                          ((vector<int,_std::allocator<int>_> *)
                           &vis.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_end_of_storage);
        u = (int)sVar5;
        for (v = 0; v < u; v = v + 1) {
          pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)
                              &vis.super__Bvector_base<std::allocator<bool>_>._M_impl.
                               super__Bvector_impl_data._M_end_of_storage,(long)v);
          local_c8 = *pvVar6;
          local_cc = 1;
          k = local_c8;
          while( true ) {
            iVar2 = local_cc;
            pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](b,(long)w._4_4_);
            if ((*pvVar4 < iVar2) || (local_c8 = *_j + local_c8, iVar1 < local_c8)) break;
            if (local_c8 == iVar1) {
              this_local._4_4_ = 0;
              goto LAB_00116ac3;
            }
            rVar9 = std::vector<bool,_std::allocator<bool>_>::operator[]
                              ((vector<bool,_std::allocator<bool>_> *)local_78,(long)local_c8);
            _auStack_e0 = rVar9;
            bVar3 = std::_Bit_reference::operator_cast_to_bool((_Bit_reference *)auStack_e0);
            if (bVar3) break;
            piVar7 = std::max<int>(&local_a8,&local_c8);
            local_a8 = *piVar7;
            std::vector<int,_std::allocator<int>_>::push_back
                      ((vector<int,_std::allocator<int>_> *)
                       &vis.super__Bvector_base<std::allocator<bool>_>._M_impl.
                        super__Bvector_impl_data._M_end_of_storage,&local_c8);
            local_cc = local_cc + 1;
          }
        }
        local_e4 = u;
        while( true ) {
          iVar2 = local_e4;
          sVar5 = std::vector<int,_std::allocator<int>_>::size
                            ((vector<int,_std::allocator<int>_> *)
                             &vis.super__Bvector_base<std::allocator<bool>_>._M_impl.
                              super__Bvector_impl_data._M_end_of_storage);
          if ((int)sVar5 <= iVar2) break;
          pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)
                              &vis.super__Bvector_base<std::allocator<bool>_>._M_impl.
                               super__Bvector_impl_data._M_end_of_storage,(long)local_e4);
          rVar9 = std::vector<bool,_std::allocator<bool>_>::operator[]
                            ((vector<bool,_std::allocator<bool>_> *)local_78,(long)*pvVar6);
          _auStack_f8 = rVar9;
          std::_Bit_reference::operator=((_Bit_reference *)auStack_f8,true);
          local_e4 = local_e4 + 1;
        }
      }
    }
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](caps,0);
    if (*pvVar4 < iVar2) {
      __range2._4_4_ = iVar1 - local_a8;
      __end2 = std::vector<int,_std::allocator<int>_>::begin(caps);
      _p = std::vector<int,_std::allocator<int>_>::end(caps);
      while( true ) {
        bVar3 = __gnu_cxx::operator!=
                          (&__end2,(__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                                    *)&p);
        if (!bVar3) break;
        piVar8 = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                 ::operator*(&__end2);
        local_120 = *piVar8;
        local_11c = local_120;
        while( true ) {
          rVar9 = std::vector<bool,_std::allocator<bool>_>::operator[]
                            ((vector<bool,_std::allocator<bool>_> *)local_78,(long)local_120);
          local_130 = rVar9;
          bVar3 = std::_Bit_reference::operator_cast_to_bool(&local_130);
          if (bVar3 || __range2._4_4_ < local_11c - local_120) break;
          local_120 = local_120 + -1;
        }
        local_134 = local_11c - local_120;
        piVar7 = std::min<int>((int *)((long)&__range2 + 4),&local_134);
        __range2._4_4_ = *piVar7;
        __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
        operator++(&__end2);
      }
      this_local._4_4_ = __range2._4_4_;
    }
    else {
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](caps,0);
      this_local._4_4_ = *pvVar4 - local_a8;
    }
LAB_00116ac3:
    local_d0 = 1;
    std::vector<bool,_std::allocator<bool>_>::~vector
              ((vector<bool,_std::allocator<bool>_> *)local_78);
    std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)
               &vis.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                _M_end_of_storage);
  }
  return this_local._4_4_;
}

Assistant:

int Arcflow::min_slack(const std::vector<int> &b, int i0, int d,
					   const std::vector<int> &caps) const {
	int C = caps.back();
	if (C == 0) {
		return 0;
	}
	std::vector<int> Q;
	std::vector<bool> vis(C + 1);
	vis[0] = true;
	Q.push_back(0);
	int res = 0;
	for (int i = i0; i < inst.nsizes; i++) {
		const int &w = weights[i][d];
		if (!w) {
			continue;
		}
		int qs = Q.size();
		for (int j = 0; j < qs; j++) {
			int u = Q[j];
			int v = u;
			for (int k = 1; k <= b[i]; k++) {
				v += w;
				if (v > C) {
					break;
				} else if (v == C) {
					return 0;
				} else if (vis[v]) {
					break;
				}
				res = std::max(res, v);
				Q.push_back(v);
			}
		}
		for (int j = qs; j < static_cast<int>(Q.size()); j++) {
			vis[Q[j]] = true;
		}
	}
	if (res <= caps[0]) {
		return caps[0] - res;
	} else {
		int mslack = C - res;
		for (int cap : caps) {
			int p = cap;
			while (!vis[p] && cap - p <= mslack) {
				p--;
			}
			mslack = std::min(mslack, cap - p);
		}
		return mslack;
	}
}